

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O3

void __thiscall DBot::ThinkForMove(DBot *this,ticcmd_t *cmd)

{
  ActorFlags *pAVar1;
  double *pdVar2;
  byte *pbVar3;
  byte bVar4;
  APlayerPawn *pAVar5;
  AWeapon *pAVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  PClass *pPVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar12;
  AActor *pAVar13;
  player_t *ppVar14;
  AActor *pAVar15;
  short sVar16;
  short sVar17;
  DObject *pDVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  TThinkerIterator<AInventory> it;
  undefined1 local_60 [32];
  DAngle local_40;
  DAngle local_38;
  
  pAVar13 = (this->dest).field_0.p;
  dVar21 = 0.0;
  if (pAVar13 != (AActor *)0x0) {
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      dVar21 = AActor::Distance2D(&this->player->mo->super_AActor,pAVar13,false);
    }
    else {
      (this->dest).field_0.p = (AActor *)0x0;
    }
  }
  pAVar13 = (this->missile).field_0.p;
  if (pAVar13 == (AActor *)0x0) goto LAB_0049fb02;
  if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
    dVar19 = (pAVar13->Vel).X;
    if (((dVar19 == 0.0) && (!NAN(dVar19))) ||
       ((dVar19 = (pAVar13->Vel).Y, dVar19 == 0.0 && (!NAN(dVar19))))) {
LAB_0049faf3:
      this->sleft = (bool)(this->sleft ^ 1);
      goto LAB_0049fafa;
    }
    local_38.Degrees = 90.0;
    bVar7 = Check_LOS(this,pAVar13,&local_38);
    if (!bVar7) goto LAB_0049faf3;
    pAVar13 = (this->missile).field_0.p;
    if (pAVar13 == (AActor *)0x0) goto LAB_0049fb02;
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_0049fafa;
    dVar19 = AActor::Distance2D(&this->player->mo->super_AActor,pAVar13,false);
    if (686.6455078125 <= dVar19) goto LAB_0049fb02;
    pAVar13 = (this->missile).field_0.p;
    if (pAVar13 == (AActor *)0x0) {
LAB_0049f9f3:
      pAVar13 = (AActor *)0x0;
    }
    else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->missile).field_0.p = (AActor *)0x0;
      goto LAB_0049f9f3;
    }
    Pitch(this,pAVar13);
    pAVar13 = (this->missile).field_0.p;
    pAVar5 = this->player->mo;
    if (pAVar13 == (AActor *)0x0) {
LAB_0049fa1b:
      pAVar13 = (AActor *)0x0;
    }
    else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->missile).field_0.p = (AActor *)0x0;
      goto LAB_0049fa1b;
    }
    AActor::AngleTo((AActor *)local_60,&pAVar5->super_AActor,SUB81(pAVar13,0));
    (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
    bVar7 = this->sleft;
    sVar16 = 0x2800;
    if (bVar7 != false) {
      sVar16 = -0x2800;
    }
    (cmd->ucmd).sidemove = sVar16;
    (cmd->ucmd).forwardmove = -0x3200;
    pAVar5 = this->player->mo;
    dVar21 = (pAVar5->super_AActor).__Pos.Z;
    dVar19 = (pAVar5->super_AActor).__Pos.X - (this->old).X;
    dVar20 = (pAVar5->super_AActor).__Pos.Y - (this->old).Y;
    if ((dVar21 * dVar21 + dVar20 * dVar20 + dVar19 * dVar19 < 0.5820766091346741) &&
       (this->t_strafe < 1)) {
      this->t_strafe = 5;
      this->sleft = (bool)(bVar7 ^ 1);
    }
    pAVar13 = (this->enemy).field_0.p;
    if (pAVar13 == (AActor *)0x0) goto LAB_004a0496;
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_004a0496;
    }
    local_40.Degrees = 60.0;
    bVar7 = Check_LOS(this,pAVar13,&local_40);
    if (!bVar7) goto LAB_004a0496;
LAB_004a03e6:
    Dofire(this,cmd);
    goto LAB_004a0496;
  }
LAB_0049fafa:
  (this->missile).field_0.p = (AActor *)0x0;
LAB_0049fb02:
  pAVar13 = (this->enemy).field_0.p;
  if (pAVar13 == (AActor *)0x0) {
LAB_0049ff05:
    pAVar13 = (this->mate).field_0.p;
    if (pAVar13 != (AActor *)0x0) {
      if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar15 = (this->enemy).field_0.p;
        if (pAVar15 != (AActor *)0x0) {
          if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049ff54;
          (this->enemy).field_0.p = (AActor *)0x0;
        }
        pAVar15 = (this->dest).field_0.p;
        if (pAVar15 != (AActor *)0x0) {
          if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if (pAVar15 != pAVar13) goto LAB_0049ff54;
          }
          else {
            (this->dest).field_0.p = (AActor *)0x0;
          }
        }
        Pitch(this,pAVar13);
        pAVar13 = (this->mate).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a01bf:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->mate).field_0.p = (AActor *)0x0;
          goto LAB_004a01bf;
        }
        bVar7 = Reachable(this,pAVar13);
        if (!bVar7) {
          pAVar13 = (this->dest).field_0.p;
          if (pAVar13 == (AActor *)0x0) {
LAB_004a025e:
            pAVar13 = (AActor *)0x0;
          }
          else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (this->dest).field_0.p = (AActor *)0x0;
            goto LAB_004a025e;
          }
          pAVar15 = (this->mate).field_0.p;
          if (pAVar15 == (AActor *)0x0) {
LAB_004a0277:
            pAVar15 = (AActor *)0x0;
          }
          else if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (this->mate).field_0.p = (AActor *)0x0;
            goto LAB_004a0277;
          }
          if ((pAVar15 == pAVar13) && (uVar9 = FRandom::GenRand32(&pr_botmove), (uVar9 & 0xe0) == 0)
             ) {
            (this->dest).field_0.p = (AActor *)0x0;
          }
          goto LAB_0049ff5b;
        }
        pAVar13 = (this->mate).field_0.p;
        pAVar5 = this->player->mo;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a01eb:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->mate).field_0.p = (AActor *)0x0;
          goto LAB_004a01eb;
        }
        AActor::AngleTo((AActor *)local_60,&pAVar5->super_AActor,SUB81(pAVar13,0));
        (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
        pAVar13 = (this->mate).field_0.p;
        pAVar5 = this->player->mo;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a0224:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->mate).field_0.p = (AActor *)0x0;
          goto LAB_004a0224;
        }
        dVar21 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
        if (dVar21 <= 457.763671875) {
          if (dVar21 <= 228.8818359375) {
            if (dVar21 < 152.587890625) {
              (cmd->ucmd).forwardmove = -0x1900;
            }
          }
          else {
            (cmd->ucmd).forwardmove = 0x1900;
          }
        }
        else {
          (cmd->ucmd).forwardmove = 0x3200;
        }
        goto LAB_004a0496;
      }
      (this->mate).field_0.p = (AActor *)0x0;
    }
LAB_0049ff54:
    this->first_shot = true;
  }
  else {
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_0049ff05;
    }
    bVar7 = P_CheckSight(&this->player->mo->super_AActor,pAVar13,0);
    if (!bVar7) goto LAB_0049ff05;
    pAVar13 = (this->enemy).field_0.p;
    if (pAVar13 == (AActor *)0x0) {
LAB_0049fb4b:
      pAVar13 = (AActor *)0x0;
    }
    else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_0049fb4b;
    }
    Pitch(this,pAVar13);
    pAVar13 = (this->dest).field_0.p;
    if (((pAVar13 == (AActor *)0x0) ||
        (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) ||
       (((pAVar13->flags).Value & 1) == 0)) {
LAB_0049fea4:
      (this->dest).field_0.p = (AActor *)0x0;
      ppVar14 = this->player;
      if ((ppVar14->ReadyWeapon != (AWeapon *)0x0) &&
         (((ppVar14->ReadyWeapon->super_AInventory).field_0x4dd & 2) == 0)) {
        pAVar1 = &(ppVar14->mo->super_AActor).flags;
        pAVar1->Value = pAVar1->Value & 0xfffffbff;
      }
      if (((((this->enemy).field_0.p)->flags3).Value & 0x2000) == 0) {
        this->t_fight = 0x46;
      }
      if ((0 < this->t_strafe) ||
         ((pAVar5 = ppVar14->mo, dVar21 = (pAVar5->super_AActor).__Pos.Z,
          dVar19 = (pAVar5->super_AActor).__Pos.X - (this->old).X,
          dVar20 = (pAVar5->super_AActor).__Pos.Y - (this->old).Y,
          0.5820766091346741 <= dVar21 * dVar21 + dVar20 * dVar20 + dVar19 * dVar19 &&
          (uVar9 = FRandom::GenRand32(&pr_botmove),
          8 < (byte)((byte)(0xaaU - ((char)(uVar9 << 4) + (char)uVar9)) >> 1 | (char)uVar9 * -0x80))
          ))) {
        bVar7 = false;
      }
      else {
        this->t_strafe = 5;
        this->sleft = (bool)(this->sleft ^ 1);
        bVar7 = true;
      }
      pAVar13 = (this->enemy).field_0.p;
      pAVar5 = this->player->mo;
      if (pAVar13 == (AActor *)0x0) {
LAB_004a0337:
        pAVar13 = (AActor *)0x0;
      }
      else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->enemy).field_0.p = (AActor *)0x0;
        goto LAB_004a0337;
      }
      AActor::AngleTo((AActor *)local_60,&pAVar5->super_AActor,SUB81(pAVar13,0));
      (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
      if (this->player->ReadyWeapon == (AWeapon *)0x0) {
LAB_004a0398:
        pAVar13 = (this->enemy).field_0.p;
        bVar4 = *(byte *)((long)&(pAVar13->flags3).Value + 1);
        sVar17 = 0x3200;
        sVar16 = 0x1900;
LAB_004a03ad:
        if ((bVar4 & 0x20) == 0) {
          sVar16 = sVar17;
        }
        (cmd->ucmd).forwardmove = sVar16;
      }
      else {
        pAVar5 = this->player->mo;
        pAVar13 = (this->enemy).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a037a:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->enemy).field_0.p = (AActor *)0x0;
          goto LAB_004a037a;
        }
        dVar21 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
        pdVar2 = &this->player->ReadyWeapon->MoveCombatDist;
        if (*pdVar2 <= dVar21 && dVar21 != *pdVar2) goto LAB_004a0398;
        pAVar13 = (this->enemy).field_0.p;
        if (!bVar7) {
          bVar4 = *(byte *)((long)&(pAVar13->flags3).Value + 1);
          sVar17 = -0x3200;
          sVar16 = -0x1900;
          goto LAB_004a03ad;
        }
      }
      bVar7 = (this->sleft & 1U) != 0;
      sVar16 = 0x2800;
      if (bVar7) {
        sVar16 = -0x2800;
      }
      sVar17 = 0x1800;
      if (bVar7) {
        sVar17 = -0x1800;
      }
      if (((pAVar13->flags3).Value >> 0xd & 1) == 0) {
        sVar17 = sVar16;
      }
      (cmd->ucmd).sidemove = sVar17;
      goto LAB_004a03e6;
    }
    if ((this->player->mo->super_AActor).health < (this->skill).isp) {
      local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Medikit",true);
      pPVar10 = PClass::FindClass((FName *)local_60);
      pPVar11 = (pAVar13->super_DThinker).super_DObject.Class;
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(pAVar13->super_DThinker).super_DObject._vptr_DObject)(pAVar13);
        pPVar11 = (PClass *)CONCAT44(extraout_var,iVar8);
        (pAVar13->super_DThinker).super_DObject.Class = pPVar11;
      }
      bVar7 = pPVar11 != (PClass *)0x0;
      if (pPVar11 != pPVar10 && bVar7) {
        do {
          pPVar11 = pPVar11->ParentClass;
          bVar7 = pPVar11 != (PClass *)0x0;
          if (pPVar11 == pPVar10) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if (!bVar7) {
        pAVar13 = (this->dest).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_0049fc1c:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->dest).field_0.p = (AActor *)0x0;
          goto LAB_0049fc1c;
        }
        local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Stimpack",true);
        pPVar10 = PClass::FindClass((FName *)local_60);
        pPVar11 = (pAVar13->super_DThinker).super_DObject.Class;
        if (pPVar11 == (PClass *)0x0) {
          iVar8 = (**(pAVar13->super_DThinker).super_DObject._vptr_DObject)(pAVar13);
          pPVar11 = (PClass *)CONCAT44(extraout_var_00,iVar8);
          (pAVar13->super_DThinker).super_DObject.Class = pPVar11;
        }
        bVar7 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar10 && bVar7) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar7 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar10) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar7) {
          pDVar18 = (this->dest).field_0.o;
          if (pDVar18 == (DObject *)0x0) {
LAB_0049fca7:
            pDVar18 = (DObject *)0x0;
          }
          else if ((pDVar18->ObjectFlags & 0x20) != 0) {
            (this->dest).field_0.p = (AActor *)0x0;
            goto LAB_0049fca7;
          }
          pPVar11 = PClass::FindClass("Soulsphere");
          bVar7 = DObject::IsKindOf(pDVar18,pPVar11);
          if (!bVar7) {
            pDVar18 = (this->dest).field_0.o;
            if (pDVar18 == (DObject *)0x0) {
LAB_0049fce1:
              pDVar18 = (DObject *)0x0;
            }
            else if ((pDVar18->ObjectFlags & 0x20) != 0) {
              (this->dest).field_0.p = (AActor *)0x0;
              goto LAB_0049fce1;
            }
            pPVar11 = PClass::FindClass("Megasphere");
            bVar7 = DObject::IsKindOf(pDVar18,pPVar11);
            if (!bVar7) {
              pDVar18 = (this->dest).field_0.o;
              if (pDVar18 == (DObject *)0x0) {
LAB_0049fd1b:
                pDVar18 = (DObject *)0x0;
              }
              else if ((pDVar18->ObjectFlags & 0x20) != 0) {
                (this->dest).field_0.p = (AActor *)0x0;
                goto LAB_0049fd1b;
              }
              pPVar11 = PClass::FindClass("CrystalVial");
              bVar7 = DObject::IsKindOf(pDVar18,pPVar11);
              if (!bVar7) {
                pAVar13 = (this->dest).field_0.p;
                if (pAVar13 != (AActor *)0x0) goto LAB_0049fd46;
                goto LAB_0049fd55;
              }
            }
          }
        }
      }
    }
    else {
LAB_0049fd46:
      if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->dest).field_0.p = (AActor *)0x0;
LAB_0049fd55:
        pAVar13 = (AActor *)0x0;
      }
      local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Invulnerability",true);
      pPVar10 = PClass::FindClass((FName *)local_60);
      pPVar11 = (pAVar13->super_DThinker).super_DObject.Class;
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(pAVar13->super_DThinker).super_DObject._vptr_DObject)(pAVar13);
        pPVar11 = (PClass *)CONCAT44(extraout_var_01,iVar8);
        (pAVar13->super_DThinker).super_DObject.Class = pPVar11;
      }
      bVar7 = pPVar11 != (PClass *)0x0;
      if (pPVar11 != pPVar10 && bVar7) {
        do {
          pPVar11 = pPVar11->ParentClass;
          bVar7 = pPVar11 != (PClass *)0x0;
          if (pPVar11 == pPVar10) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if (!bVar7) {
        pAVar13 = (this->dest).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_0049fde0:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->dest).field_0.p = (AActor *)0x0;
          goto LAB_0049fde0;
        }
        local_60._0_4_ = FName::NameManager::FindName(&FName::NameData,"Invisibility",true);
        pPVar10 = PClass::FindClass((FName *)local_60);
        pPVar11 = (pAVar13->super_DThinker).super_DObject.Class;
        if (pPVar11 == (PClass *)0x0) {
          iVar8 = (**(pAVar13->super_DThinker).super_DObject._vptr_DObject)(pAVar13);
          pPVar11 = (PClass *)CONCAT44(extraout_var_02,iVar8);
          (pAVar13->super_DThinker).super_DObject.Class = pPVar11;
        }
        bVar7 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar10 && bVar7) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar7 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar10) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar7) {
          pDVar18 = (this->dest).field_0.o;
          if (pDVar18 == (DObject *)0x0) {
LAB_004a051a:
            pDVar18 = (DObject *)0x0;
          }
          else if ((pDVar18->ObjectFlags & 0x20) != 0) {
            (this->dest).field_0.p = (AActor *)0x0;
            goto LAB_004a051a;
          }
          pPVar11 = PClass::FindClass("Megasphere");
          bVar7 = DObject::IsKindOf(pDVar18,pPVar11);
          if (((133.514404296875 <= dVar21) && (!bVar7)) &&
             ((pAVar6 = this->player->ReadyWeapon, pAVar6 != (AWeapon *)0x0 &&
              (((pAVar6->super_AInventory).field_0x4dd & 2) == 0)))) goto LAB_0049fea4;
        }
      }
    }
    if (((534.0576171875 <= dVar21) &&
        (pAVar6 = this->player->ReadyWeapon, pAVar6 != (AWeapon *)0x0)) &&
       (((pAVar6->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_0049fea4;
    pAVar13 = (this->dest).field_0.p;
    if (pAVar13 == (AActor *)0x0) {
LAB_0049fe92:
      pAVar13 = (AActor *)0x0;
    }
    else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->dest).field_0.p = (AActor *)0x0;
      goto LAB_0049fe92;
    }
    bVar7 = Reachable(this,pAVar13);
    if (!bVar7) goto LAB_0049fea4;
  }
LAB_0049ff5b:
  pAVar13 = (this->enemy).field_0.p;
  if (pAVar13 != (AActor *)0x0) {
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      local_60._24_8_ = (DObject *)0x4056800000000000;
      bVar7 = Check_LOS(this,pAVar13,(DAngle *)(local_60 + 0x18));
      if (bVar7) {
        Dofire(this,cmd);
      }
    }
    else {
      (this->enemy).field_0.p = (AActor *)0x0;
    }
  }
  pAVar13 = (this->dest).field_0.p;
  if (pAVar13 == (AActor *)0x0) {
LAB_0049ffce:
    if ((this->t_fight == 0) || (pAVar13 = (this->enemy).field_0.p, pAVar13 == (AActor *)0x0)) {
LAB_004a0071:
      uVar9 = FRandom::GenRand32(&pr_botmove);
      if ((uVar9 & 0xff) < 0x80) {
        if (bglobal.firstthing.field_0 == (AActor *)0x0) {
LAB_004a00ab:
          aVar12.p = (AActor *)0x0;
        }
        else {
          aVar12 = bglobal.firstthing.field_0;
          if ((*(byte *)((long)bglobal.firstthing.field_0 + 0x20) & 0x20) != 0) {
            bglobal.firstthing.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
            goto LAB_004a00ab;
          }
        }
        FThinkerIterator::FThinkerIterator
                  ((FThinkerIterator *)local_60,AInventory::RegistrationInfo.MyClass,0x80,
                   &(aVar12.p)->super_DThinker);
        aVar12.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
        if ((aVar12.p != (AActor *)0x0) ||
           (aVar12.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60),
           aVar12.p != (AActor *)0x0)) {
          uVar9 = uVar9 & 0x3f;
          if (uVar9 != 0) {
            do {
              aVar12.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            if (aVar12.p == (AActor *)0x0) {
              aVar12.p = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_60);
            }
          }
          bglobal.firstthing.field_0 = aVar12;
          (this->dest).field_0.p = (AActor *)aVar12;
        }
LAB_004a0462:
        pAVar13 = (this->dest).field_0.p;
      }
      else {
        pAVar13 = (this->mate).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a015a:
          if ((playeringame[uVar9 & 7] != true) ||
             (pAVar13 = (AActor *)(&players)[(ulong)(uVar9 & 7) * 0x54], pAVar13->health < 1))
          goto LAB_004a0462;
          goto LAB_004a018f;
        }
        if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->mate).field_0.p = (AActor *)0x0;
          goto LAB_004a015a;
        }
        if (0xb2 < (uVar9 & 0xff)) {
          bVar7 = P_CheckSight(&this->player->mo->super_AActor,pAVar13,0);
          if (!bVar7) goto LAB_004a015a;
          pAVar13 = (this->mate).field_0.p;
        }
LAB_004a0149:
        (this->dest).field_0.p = pAVar13;
      }
      if (pAVar13 == (AActor *)0x0) goto LAB_004a0496;
    }
    else {
      if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->enemy).field_0.p = (AActor *)0x0;
        goto LAB_004a0071;
      }
      if (pAVar13->player != (player_t *)0x0) {
        pAVar6 = pAVar13->player->ReadyWeapon;
        if (((pAVar6 != (AWeapon *)0x0) && (((pAVar6->super_AInventory).field_0x4df & 0x40) != 0))
           || (uVar9 = FRandom::GenRand32(&pr_botmove),
              (this->skill).isp <
              (int)(uint)(byte)((char)uVar9 + (char)((uVar9 & 0xff) * 0x29 >> 0xc) * -100))) {
          ppVar14 = this->player;
          if ((ppVar14->ReadyWeapon == (AWeapon *)0x0) ||
             (((ppVar14->ReadyWeapon->super_AInventory).field_0x4dd & 2) != 0)) goto LAB_004a042d;
          pAVar13 = (this->enemy).field_0.p;
          goto LAB_004a0149;
        }
        ppVar14 = this->player;
LAB_004a042d:
        pAVar5 = ppVar14->mo;
        pAVar13 = (this->enemy).field_0.p;
        if (pAVar13 == (AActor *)0x0) {
LAB_004a0447:
          pAVar13 = (AActor *)0x0;
        }
        else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->enemy).field_0.p = (AActor *)0x0;
          goto LAB_004a0447;
        }
        AActor::AngleTo((AActor *)local_60,&pAVar5->super_AActor,SUB81(pAVar13,0));
        (this->Angle).Degrees = (double)CONCAT44(local_60._4_4_,local_60._0_4_);
        goto LAB_004a0462;
      }
LAB_004a018f:
      (this->dest).field_0.p = pAVar13;
    }
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      this->t_roam = 0x8c;
      goto LAB_004a047b;
    }
  }
  else {
    if ((((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) ||
       ((((pAVar13->flags).Value & 1) == 0 && (pAVar13->health < 0)))) {
      (this->dest).field_0.p = (AActor *)0x0;
      goto LAB_0049ffce;
    }
LAB_004a047b:
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      Roam(this,cmd);
      goto LAB_004a0496;
    }
  }
  (this->dest).field_0.p = (AActor *)0x0;
LAB_004a0496:
  if ((this->t_roam == 0) && (pAVar13 = (this->dest).field_0.p, pAVar13 != (AActor *)0x0)) {
    if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (this->prev).field_0.p = pAVar13;
    }
    (this->dest).field_0.p = (AActor *)0x0;
  }
  pAVar5 = this->player->mo;
  if (this->t_fight < 0x23) {
    pbVar3 = (byte *)((long)&(pAVar5->super_AActor).flags.Value + 1);
    *pbVar3 = *pbVar3 | 4;
  }
  dVar21 = (pAVar5->super_AActor).__Pos.Y;
  (this->old).X = (pAVar5->super_AActor).__Pos.X;
  (this->old).Y = dVar21;
  return;
}

Assistant:

void DBot::ThinkForMove (ticcmd_t *cmd)
{
	double dist;
	bool stuck;
	int r;

	stuck = false;
	dist = dest ? player->mo->Distance2D(dest) : 0;

	if (missile &&
		(!missile->Vel.X || !missile->Vel.Y || !Check_LOS(missile, SHOOTFOV*3/2)))
	{
		sleft = !sleft;
		missile = NULL; //Probably ended its travel.
	}

#if 0	// this has always been broken and without any reference it cannot be fixed.
	if (player->mo->Angles.Pitch > 0)
		player->mo->Angles.Pitch -= 80;
	else if (player->mo->Angles.Pitch <= -60)
		player->mo->Angles.Pitch += 80;
#endif

	//HOW TO MOVE:
	if (missile && (player->mo->Distance2D(missile)<AVOID_DIST)) //try avoid missile got from P_Mobj.c thinking part.
	{
		Pitch (missile);
		Angle = player->mo->AngleTo(missile);
		cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		cmd->ucmd.forwardmove = -FORWARDRUN; //Back IS best.

		if ((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			&& t_strafe<=0)
		{
			t_strafe = 5;
			sleft = !sleft;
		}

		//If able to see enemy while avoiding missile, still fire at enemy.
		if (enemy && Check_LOS (enemy, SHOOTFOV)) 
			Dofire (cmd); //Order bot to fire current weapon
	}
	else if (enemy && P_CheckSight (player->mo, enemy, 0)) //Fight!
	{
		Pitch (enemy);

		//Check if it's more important to get an item than fight.
		if (dest && (dest->flags&MF_SPECIAL)) //Must be an item, that is close enough.
		{
#define is(x) dest->IsKindOf (PClass::FindClass (#x))
			if (
				(
				 (player->mo->health < skill.isp &&
				  (is (Medikit) ||
				   is (Stimpack) ||
				   is (Soulsphere) ||
				   is (Megasphere) ||
				   is (CrystalVial)
				  )
				 ) || (
				  is (Invulnerability) ||
				  is (Invisibility) ||
				  is (Megasphere)
				 ) || 
				 dist < (GETINCOMBAT/4) ||
				 (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)
				)
				&& (dist < GETINCOMBAT || (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
				&& Reachable (dest))
#undef is
			{
				goto roam; //Pick it up, no matter the situation. All bonuses are nice close up.
			}
		}

		dest = NULL; //To let bot turn right

		if (player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
			player->mo->flags &= ~MF_DROPOFF; //Don't jump off any ledges when fighting.

		if (!(enemy->flags3 & MF3_ISMONSTER))
			t_fight = AFTERTICS;

		if (t_strafe <= 0 &&
			((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			|| ((pr_botmove()%30)==10))
			)
		{
			stuck = true;
			t_strafe = 5;
			sleft = !sleft;
		}

		Angle = player->mo->AngleTo(enemy);

		if (player->ReadyWeapon == NULL ||
			player->mo->Distance2D(enemy) >
			player->ReadyWeapon->MoveCombatDist)
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? FORWARDWALK : FORWARDRUN;
		}
		else if (!stuck) //Too close, so move away.
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? -FORWARDWALK : -FORWARDRUN;
		}

		//Strafing.
		if (enemy->flags3 & MF3_ISMONSTER) //It's just a monster so take it down cool.
		{
			cmd->ucmd.sidemove = sleft ? -SIDEWALK : SIDEWALK;
		}
		else
		{
			cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		}
		Dofire (cmd); //Order bot to fire current weapon
	}
	else if (mate && !enemy && (!dest || dest==mate)) //Follow mate move.
	{
		double matedist;

		Pitch (mate);

		if (!Reachable (mate))
		{
			if (mate == dest && pr_botmove.Random() < 32)
			{ // [RH] If the mate is the dest, pick a new dest sometimes
				dest = NULL;
			}
			goto roam;
		}

		Angle = player->mo->AngleTo(mate);

		matedist = player->mo->Distance2D(mate);
		if (matedist > (FRIEND_DIST*2))
			cmd->ucmd.forwardmove = FORWARDRUN;
		else if (matedist > FRIEND_DIST)
			cmd->ucmd.forwardmove = FORWARDWALK; //Walk, when starting to get close.
		else if (matedist < FRIEND_DIST-(FRIEND_DIST/3)) //Got too close, so move away.
			cmd->ucmd.forwardmove = -FORWARDWALK;
	}
	else //Roam after something.
	{
		first_shot = true;

	/////
	roam:
	/////
		if (enemy && Check_LOS (enemy, SHOOTFOV*3/2)) //If able to see enemy while avoiding missile , still fire at it.
			Dofire (cmd); //Order bot to fire current weapon

		if (dest && !(dest->flags&MF_SPECIAL) && dest->health < 0)
		{ //Roaming after something dead.
			dest = NULL;
		}

		if (dest == NULL)
		{
			if (t_fight && enemy) //Enemy/bot has jumped around corner. So what to do?
			{
				if (enemy->player)
				{
					if (((enemy->player->ReadyWeapon != NULL && enemy->player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE) ||
						(pr_botmove()%100)>skill.isp) && player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
						dest = enemy;//Dont let enemy kill the bot by supressive fire. So charge enemy.
					else //hide while t_fight, but keep view at enemy.
						Angle = player->mo->AngleTo(enemy);
				} //Just a monster, so kill it.
				else
					dest = enemy;

				//VerifFavoritWeapon(player); //Dont know why here.., but it must be here, i know the reason, but not why at this spot, uh.
			}
			else //Choose a distant target. to get things going.
			{
				r = pr_botmove();
				if (r < 128)
				{
					TThinkerIterator<AInventory> it (MAX_STATNUM+1, bglobal.firstthing);
					AInventory *item = it.Next();

					if (item != NULL || (item = it.Next()) != NULL)
					{
						r &= 63;	// Only scan up to 64 entries at a time
						while (r)
						{
							--r;
							item = it.Next();
						}
						if (item == NULL)
						{
							item = it.Next();
						}
						bglobal.firstthing = item;
						dest = item;
					}
				}
				else if (mate && (r < 179 || P_CheckSight(player->mo, mate)))
				{
					dest = mate;
				}
				else if ((playeringame[(r&(MAXPLAYERS-1))]) && players[(r&(MAXPLAYERS-1))].mo->health > 0)
				{
					dest = players[(r&(MAXPLAYERS-1))].mo; 
				}
			}

			if (dest)
			{
				t_roam = MAXROAM;
			}
		}
		if (dest)
		{ //Bot has a target so roam after it.
			Roam (cmd);
		}

	} //End of movement main part.

	if (!t_roam && dest)
	{
		prev = dest;
		dest = NULL;
	}

	if (t_fight<(AFTERTICS/2))
		player->mo->flags |= MF_DROPOFF;

	old = player->mo->Pos();
}